

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

spirv_cross * __thiscall
spirv_cross::
join<char_const(&)[13],char_const*&,unsigned_long,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[12],std::__cxx11::string,char_const(&)[3]>
          (spirv_cross *this,char (*ts) [13],char **ts_1,unsigned_long *ts_2,char (*ts_3) [2],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_4,char (*ts_5) [12],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_6,char (*ts_7) [3])

{
  undefined1 local_1130 [8];
  StringStream<4096UL,_4096UL> stream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_local_4;
  char (*ts_local_3) [2];
  unsigned_long *ts_local_2;
  char **ts_local_1;
  char (*ts_local) [13];
  
  stream.saved_buffers.stack_storage.aligned_char._184_8_ = ts_4;
  StringStream<4096UL,_4096UL>::StringStream((StringStream<4096UL,_4096UL> *)local_1130);
  inner::
  join_helper<char_const(&)[13],char_const*&,unsigned_long,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[12],std::__cxx11::string,char_const(&)[3]>
            ((StringStream<4096UL,_4096UL> *)local_1130,ts,ts_1,ts_2,ts_3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             stream.saved_buffers.stack_storage.aligned_char._184_8_,ts_5,ts_6,ts_7);
  StringStream<4096ul,4096ul>::str_abi_cxx11_((StringStream<4096ul,4096ul> *)this);
  StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1130);
  return this;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}